

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdbinarypacking.h
# Opt level: O3

void __thiscall
FastPForLib::SIMDBinaryPacking::encodeArray
          (SIMDBinaryPacking *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  long lVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t i;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  __m128i *out_00;
  uint32_t *puVar19;
  ulong uVar20;
  __m128i *out_01;
  ushort uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  uint32_t Bs [16];
  undefined1 local_88 [64];
  uint32_t *local_48;
  size_t *local_40;
  uint32_t *local_38;
  
  local_40 = nvalue;
  checkifdivisibleby(length,0x80);
  puVar10 = in + length;
  out_01 = (__m128i *)(out + 1);
  local_48 = out;
  *out = (uint32_t)length;
  puVar19 = in;
  if (0x7ff < (long)length) {
    local_38 = puVar10;
    puVar9 = in + 0x800;
    do {
      puVar19 = puVar9;
      puVar10 = in;
      lVar13 = 0;
      do {
        lVar1 = lVar13 + 1;
        auVar23 = ZEXT1664((undefined1  [16])0x0);
        lVar16 = 0;
        do {
          auVar23 = vpord_avx512f(auVar23,*(undefined1 (*) [64])(puVar10 + lVar16));
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x80);
        auVar22 = vextracti64x4_avx512f(auVar23,1);
        auVar23 = vpord_avx512f(auVar23,ZEXT3264(auVar22));
        auVar4 = vpor_avx(auVar23._0_16_,auVar23._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpor_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpor_avx(auVar4,auVar5);
        iVar17 = 0x20 - LZCOUNT(auVar4._0_4_);
        if (auVar4._0_4_ == 0) {
          iVar17 = 0;
        }
        puVar10 = puVar10 + 0x80;
        *(int *)(local_88 + lVar13 * 4) = iVar17;
        lVar13 = lVar1;
      } while (lVar1 != 0x10);
      lVar13 = 0;
      *(undefined4 *)*out_01 =
           local_88._8_4_ << 8 | local_88._4_4_ << 0x10 | local_88._0_4_ << 0x18 | local_88._12_4_;
      *(undefined4 *)((long)*out_01 + 4) =
           local_88._24_4_ << 8 | local_88._20_4_ << 0x10 | local_88._16_4_ << 0x18 |
           local_88._28_4_;
      *(undefined4 *)(*out_01 + 1) =
           local_88._40_4_ << 8 | local_88._36_4_ << 0x10 | local_88._32_4_ << 0x18 |
           local_88._44_4_;
      *(undefined4 *)((long)*out_01 + 0xc) =
           local_88._56_4_ << 8 | local_88._52_4_ << 0x10 | local_88._48_4_ << 0x18 |
           local_88._60_4_;
      out_01 = out_01 + 1;
      puVar10 = in;
      do {
        uVar2 = *(uint32_t *)(local_88 + lVar13 * 4);
        SIMD_fastpackwithoutmask_32(puVar10,out_01,uVar2);
        lVar13 = lVar13 + 1;
        puVar10 = puVar10 + 0x80;
        out_01 = (__m128i *)((long)*out_01 + (ulong)(uVar2 << 2) * 4);
      } while (lVar13 != 0x10);
      puVar9 = puVar19 + 0x800;
      in = in + 0x800;
      puVar10 = local_38;
    } while (puVar9 <= local_38);
  }
  out_00 = out_01;
  if (puVar19 < puVar10) {
    uVar20 = (long)puVar10 - (long)puVar19 >> 2;
    local_88 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    uVar11 = uVar20 + 0x7f;
    if ((long)uVar20 < 0) {
      uVar20 = uVar11;
    }
    uVar12 = 0;
    if (0xfe < uVar11) {
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar15 = 0x80;
      uVar12 = 0;
      uVar14 = 0;
      do {
        auVar28 = ZEXT1664((undefined1  [16])0x0);
        uVar18 = 0;
        auVar25 = vpbroadcastq_avx512f();
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar28);
          auVar28 = vporq_avx512f(auVar26,auVar23);
          auVar26 = vporq_avx512f(auVar26,auVar24);
          uVar6 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar28,auVar25,2);
          bVar8 = (byte)uVar6;
          uVar21 = CONCAT11(bVar8,bVar7);
          auVar28 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar19 + uVar12 + uVar18));
          auVar26._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar28._4_4_;
          auVar26._0_4_ = (uint)(bVar7 & 1) * auVar28._0_4_;
          auVar26._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar28._8_4_;
          auVar26._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar28._12_4_;
          auVar26._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar28._16_4_;
          auVar26._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar28._20_4_;
          auVar26._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar28._24_4_;
          auVar26._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar28._28_4_;
          auVar26._32_4_ = (uint)(bVar8 & 1) * auVar28._32_4_;
          auVar26._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar28._36_4_;
          auVar26._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar28._40_4_;
          auVar26._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar28._44_4_;
          auVar26._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar28._48_4_;
          auVar26._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar28._52_4_;
          auVar26._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar28._56_4_;
          auVar26._60_4_ = (uint)(bVar8 >> 7) * auVar28._60_4_;
          uVar18 = uVar18 + 0x10;
          auVar28 = vpord_avx512f(auVar26,auVar27);
        } while (((((ulong)uVar15 * 4 + (ulong)uVar12 * -4) - 4 >> 2) + 0x10 & 0xfffffffffffffff0)
                 != uVar18);
        auVar25 = vmovdqa32_avx512f(auVar28);
        auVar28._0_4_ = (uint)(bVar7 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._0_4_
        ;
        bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar27._4_4_;
        bVar3 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar27._8_4_;
        bVar3 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar27._12_4_;
        bVar3 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar27._16_4_;
        bVar3 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar27._20_4_;
        bVar3 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar27._24_4_;
        bVar3 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar28._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar27._28_4_;
        auVar28._32_4_ =
             (uint)(bVar8 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar28._36_4_ = (uint)bVar3 * auVar25._36_4_ | (uint)!bVar3 * auVar27._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar28._40_4_ = (uint)bVar3 * auVar25._40_4_ | (uint)!bVar3 * auVar27._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar28._44_4_ = (uint)bVar3 * auVar25._44_4_ | (uint)!bVar3 * auVar27._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar28._48_4_ = (uint)bVar3 * auVar25._48_4_ | (uint)!bVar3 * auVar27._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar28._52_4_ = (uint)bVar3 * auVar25._52_4_ | (uint)!bVar3 * auVar27._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar28._56_4_ = (uint)bVar3 * auVar25._56_4_ | (uint)!bVar3 * auVar27._56_4_;
        auVar28._60_4_ =
             (uint)(bVar8 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar27._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar28,1);
        auVar25 = vpord_avx512f(auVar28,ZEXT3264(auVar22));
        auVar4 = vpor_avx(auVar25._0_16_,auVar25._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpor_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpor_avx(auVar4,auVar5);
        iVar17 = 0x20 - LZCOUNT(auVar4._0_4_);
        if (auVar4._0_4_ == 0) {
          iVar17 = 0;
        }
        uVar12 = uVar12 + 0x80;
        uVar15 = uVar15 + 0x80;
        *(int *)(local_88 + uVar14 * 4) = iVar17;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (uVar14 < (ulong)((long)uVar20 >> 7));
      uVar12 = local_88._8_4_ << 8 | local_88._4_4_ << 0x10 | local_88._0_4_ << 0x18 |
               local_88._12_4_;
    }
    *(uint *)*out_01 = uVar12;
    out_00 = out_01 + 1;
    *(undefined4 *)((long)*out_01 + 4) =
         local_88._24_4_ << 8 | local_88._20_4_ << 0x10 | local_88._16_4_ << 0x18 | local_88._28_4_;
    *(undefined4 *)(*out_01 + 1) =
         local_88._40_4_ << 8 | local_88._36_4_ << 0x10 | local_88._32_4_ << 0x18 | local_88._44_4_;
    *(undefined4 *)((long)*out_01 + 0xc) =
         local_88._56_4_ << 8 | local_88._52_4_ << 0x10 | local_88._48_4_ << 0x18 | local_88._60_4_;
    if (0xfe < uVar11) {
      uVar18 = 0;
      uVar11 = 0;
      uVar14 = 1;
      do {
        uVar2 = *(uint32_t *)(local_88 + uVar11 * 4);
        SIMD_fastpackwithoutmask_32(puVar19 + uVar18,out_00,uVar2);
        uVar18 = (ulong)((int)uVar18 + 0x80);
        out_00 = (__m128i *)((long)*out_00 + (ulong)(uVar2 << 2) * 4);
        bVar3 = uVar14 < (ulong)((long)uVar20 >> 7);
        uVar11 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar3);
    }
  }
  *local_40 = (long)out_00 - (long)local_48 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    const uint32_t *const final = in + length;
    for (; in + HowManyMiniBlocks * MiniBlockSize <= final;
         in += HowManyMiniBlocks * MiniBlockSize) {

      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
    }
    if (in < final) {
      const size_t howmany = (final - in) / MiniBlockSize;
      memset(&Bs[0], 0, HowManyMiniBlocks * sizeof(uint32_t));
      for (uint32_t i = 0; i < howmany; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < howmany; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
      in += howmany * MiniBlockSize;
      assert(in == final);
    }

    nvalue = out - initout;
  }